

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int mbedtls_entropy_gather(mbedtls_entropy_context *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  size_t sStack_c0;
  uchar auStack_b8 [136];
  
  iVar3 = ctx->source_count;
  if (iVar3 == 0) {
    iVar2 = -0x40;
  }
  else {
    piVar4 = &ctx->source[0].strong;
    iVar2 = -0x3c;
    bVar1 = false;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      if (*piVar4 == 1) {
        bVar1 = true;
      }
      sStack_c0 = 0;
      iVar2 = (*((mbedtls_entropy_source_state *)(piVar4 + -8))->f_source)
                        (*(void **)(piVar4 + -6),auStack_b8,0x80,&sStack_c0);
      if (iVar2 != 0) goto LAB_0010d212;
      if (sStack_c0 != 0) {
        iVar3 = entropy_update(ctx,(uchar)lVar5,auStack_b8,sStack_c0);
        if (iVar3 != 0) {
          return iVar3;
        }
        *(size_t *)(piVar4 + -4) = *(size_t *)(piVar4 + -4) + sStack_c0;
      }
      iVar3 = ctx->source_count;
      piVar4 = piVar4 + 10;
      iVar2 = 0;
    }
    if (!bVar1) {
      iVar2 = -0x3d;
    }
LAB_0010d212:
    mbedtls_platform_zeroize(auStack_b8,0x80);
  }
  return iVar2;
}

Assistant:

int mbedtls_entropy_gather( mbedtls_entropy_context *ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    ret = entropy_gather_internal( ctx );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}